

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

void parse_blend_axis_types(T1_Face face,T1_Loader loader)

{
  FT_Memory memory;
  void *P;
  FT_Pointer __dest;
  ulong __n;
  ulong uVar1;
  T1_Token pTVar2;
  long lVar3;
  undefined1 local_a8 [8];
  T1_TokenRec axis_tokens [4];
  FT_UInt local_38;
  FT_Error local_34;
  FT_Int num_axis;
  FT_Error error;
  
  local_34 = 0;
  pTVar2 = (T1_Token)local_a8;
  (*(loader->parser).root.funcs.to_token_array)((PS_Parser)loader,pTVar2,4,(FT_Int *)&local_38);
  if ((int)local_38 < 0) {
    local_34 = 0xa2;
  }
  else if (local_38 == 0 || 4 < (int)local_38) {
LAB_00236e2d:
    local_34 = 3;
  }
  else {
    local_34 = t1_allocate_blend(face,0,local_38);
    if ((local_34 == 0) && (0 < (int)local_38)) {
      memory = (face->root).memory;
      axis_tokens[3]._16_8_ = face->blend;
      lVar3 = 0;
      do {
        if (*pTVar2->start == '/') {
          pTVar2->start = pTVar2->start + 1;
        }
        uVar1 = (long)pTVar2->limit - (long)pTVar2->start;
        __n = uVar1 & 0xffffffff;
        if (__n == 0) goto LAB_00236e2d;
        P = *(void **)(axis_tokens[3]._16_8_ + 8 + lVar3 * 8);
        if (P != (void *)0x0) {
          ft_mem_free(memory,P);
        }
        __dest = ft_mem_alloc(memory,(ulong)((int)uVar1 + 1),&local_34);
        *(FT_Pointer *)(axis_tokens[3]._16_8_ + 8 + lVar3 * 8) = __dest;
        if (local_34 != 0) break;
        memcpy(__dest,pTVar2->start,__n);
        *(undefined1 *)((long)__dest + __n) = 0;
        lVar3 = lVar3 + 1;
        pTVar2 = pTVar2 + 1;
      } while (lVar3 < (int)local_38);
    }
  }
  (loader->parser).root.error = local_34;
  return;
}

Assistant:

static void
  parse_blend_axis_types( T1_Face    face,
                          T1_Loader  loader )
  {
    T1_TokenRec  axis_tokens[T1_MAX_MM_AXIS];
    FT_Int       n, num_axis;
    FT_Error     error = FT_Err_Ok;
    PS_Blend     blend;
    FT_Memory    memory;


    /* take an array of objects */
    T1_ToTokenArray( &loader->parser, axis_tokens,
                     T1_MAX_MM_AXIS, &num_axis );
    if ( num_axis < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( num_axis == 0 || num_axis > T1_MAX_MM_AXIS )
    {
      FT_ERROR(( "parse_blend_axis_types: incorrect number of axes: %d\n",
                 num_axis ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* allocate blend if necessary */
    error = t1_allocate_blend( face, 0, (FT_UInt)num_axis );
    if ( error )
      goto Exit;

    blend  = face->blend;
    memory = face->root.memory;

    /* each token is an immediate containing the name of the axis */
    for ( n = 0; n < num_axis; n++ )
    {
      T1_Token  token = axis_tokens + n;
      FT_Byte*  name;
      FT_UInt   len;


      /* skip first slash, if any */
      if ( token->start[0] == '/' )
        token->start++;

      len = (FT_UInt)( token->limit - token->start );
      if ( len == 0 )
      {
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      name = (FT_Byte*)blend->axis_names[n];
      if ( name )
      {
        FT_TRACE0(( "parse_blend_axis_types:"
                    " overwriting axis name `%s' with `%*.s'\n",
                    name, len, token->start ));
        FT_FREE( name );
      }

      if ( FT_ALLOC( blend->axis_names[n], len + 1 ) )
        goto Exit;

      name = (FT_Byte*)blend->axis_names[n];
      FT_MEM_COPY( name, token->start, len );
      name[len] = '\0';
    }

  Exit:
    loader->parser.root.error = error;
  }